

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep.cpp
# Opt level: O1

ON_BrepLoop * __thiscall ON_Brep::NewLoop(ON_Brep *this,TYPE looptype)

{
  int iVar1;
  ON_BrepLoop *pOVar2;
  long lVar3;
  uint uVar4;
  
  ON_BoundingBox::Destroy(&this->m_bbox);
  this->m_is_solid = 0;
  iVar1 = (this->m_L).super_ON_ObjectArray<ON_BrepLoop>.super_ON_ClassArray<ON_BrepLoop>.m_count;
  lVar3 = (long)iVar1;
  uVar4 = (uint)(lVar3 + 1U);
  if ((uint)(this->m_L).super_ON_ObjectArray<ON_BrepLoop>.super_ON_ClassArray<ON_BrepLoop>.
            m_capacity < uVar4) {
    ON_ClassArray<ON_BrepLoop>::SetCapacity((ON_ClassArray<ON_BrepLoop> *)&this->m_L,lVar3 + 1U);
  }
  if ((-2 < iVar1) &&
     (iVar1 < (this->m_L).super_ON_ObjectArray<ON_BrepLoop>.super_ON_ClassArray<ON_BrepLoop>.
              m_capacity)) {
    (this->m_L).super_ON_ObjectArray<ON_BrepLoop>.super_ON_ClassArray<ON_BrepLoop>.m_count = uVar4;
  }
  pOVar2 = (this->m_L).super_ON_ObjectArray<ON_BrepLoop>.super_ON_ClassArray<ON_BrepLoop>.m_a;
  pOVar2[lVar3].m_loop_index = iVar1;
  pOVar2[lVar3].m_type = looptype;
  pOVar2[lVar3].m_brep = this;
  return pOVar2 + lVar3;
}

Assistant:

ON_BrepLoop& 
ON_Brep::NewLoop( ON_BrepLoop::TYPE looptype )
{
  // 2 Sept 2020 S. Baer (RH-59952)
  // Destroy cached bounding box on breps when messing around with loops
  m_bbox.Destroy();
  m_is_solid = 0;
  int li = m_L.Count();
  m_L.Reserve(li+1);
  m_L.SetCount(li+1);
  ON_BrepLoop& loop =  m_L.Array()[li];
  loop.m_loop_index = li;
  loop.m_type = looptype;
  loop.m_brep = this;
  return loop;
}